

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_map_delete(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSMapState *s;
  JSMapRecord *mr;
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  JSValue JVar4;
  JSValue key;
  
  s = (JSMapState *)JS_GetOpaque2(ctx,this_val,magic + 0x1f);
  if (s == (JSMapState *)0x0) {
    iVar2 = 6;
    JVar3.float64 = 0.0;
  }
  else {
    JVar1 = (JSValueUnion)argv->tag;
    JVar3.ptr = (argv->u).ptr;
    if (((ulong)(argv->u).ptr & 0x7fffffffffffffff) == 0 && (argv->tag & 0xffffffffU) == 7) {
      JVar1.float64 = 0.0;
      JVar3.float64 = 0.0;
    }
    key.tag = (int64_t)JVar1.ptr;
    key.u.ptr = JVar3.ptr;
    mr = map_find_record(ctx,s,key);
    if (mr != (JSMapRecord *)0x0) {
      map_delete_record(ctx->rt,s,mr);
    }
    JVar3._1_7_ = 0;
    JVar3.int32._0_1_ = mr != (JSMapRecord *)0x0;
    iVar2 = 1;
  }
  JVar4.tag = iVar2;
  JVar4.u.float64 = JVar3.float64;
  return JVar4;
}

Assistant:

static JSValue js_map_delete(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    mr = map_find_record(ctx, s, key);
    if (!mr)
        return JS_FALSE;
    map_delete_record(ctx->rt, s, mr);
    return JS_TRUE;
}